

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall argo::lexer::consume_white_space(lexer *this)

{
  uint uVar1;
  int c;
  lexer *this_local;
  
  do {
    do {
      uVar1 = (*this->m_reader->_vptr_reader[2])();
    } while (uVar1 == 0x20);
  } while (((uVar1 == 9) || (uVar1 == 10)) || (uVar1 == 0xd));
  (*this->m_reader->_vptr_reader[3])(this->m_reader,(ulong)uVar1);
  return;
}

Assistant:

void lexer::consume_white_space()
{
    while (true)
    {
        int c = m_reader.next();

        if ((c == 0x20) || (c == 0x09) || (c == 0x0A) || (c == 0x0D))
        {
            continue;
        }
        else
        {
            m_reader.put_back(c);
            return;
        }
    }
}